

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccoefct.c
# Opt level: O1

void jinit_c_coef_controller(j_compress_ptr cinfo,boolean need_full_buffer)

{
  _func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *p_Var1;
  jpeg_c_coef_controller *pjVar2;
  long lVar3;
  long lVar4;
  jvirt_barray_ptr pjVar5;
  void *pvVar6;
  int *piVar7;
  long lVar8;
  undefined1 auVar9 [16];
  
  pjVar2 = (jpeg_c_coef_controller *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0xc0);
  cinfo->coef = pjVar2;
  pjVar2->start_pass = start_pass_coef;
  if (need_full_buffer == 0) {
    pvVar6 = (*cinfo->mem->alloc_large)((j_common_ptr)cinfo,1,0x500);
    lVar3 = 0;
    lVar4 = 1;
    lVar8 = 4;
    auVar9._8_4_ = (int)pvVar6;
    auVar9._0_8_ = pvVar6;
    auVar9._12_4_ = (int)((ulong)pvVar6 >> 0x20);
    do {
      (&pjVar2->start_pass)[lVar8] =
           (_func_void_j_compress_ptr_J_BUF_MODE *)(lVar3 * 0x80 + (long)pvVar6);
      (&pjVar2->start_pass + lVar8)[1] =
           (_func_void_j_compress_ptr_J_BUF_MODE *)(lVar4 * 0x80 + auVar9._8_8_);
      lVar3 = lVar3 + 2;
      lVar4 = lVar4 + 2;
      lVar8 = lVar8 + 2;
    } while (lVar8 != 0xe);
    pjVar2[7].start_pass = (_func_void_j_compress_ptr_J_BUF_MODE *)0x0;
  }
  else if (0 < cinfo->num_components) {
    piVar7 = &cinfo->comp_info->h_samp_factor;
    lVar8 = 0;
    do {
      p_Var1 = cinfo->mem->request_virt_barray;
      lVar3 = jround_up((ulong)(uint)piVar7[5],(long)*piVar7);
      lVar4 = jround_up((ulong)(uint)piVar7[6],(long)piVar7[1]);
      pjVar5 = (*p_Var1)((j_common_ptr)cinfo,1,0,(JDIMENSION)lVar3,(JDIMENSION)lVar4,piVar7[1]);
      (&pjVar2[7].start_pass)[lVar8] = (_func_void_j_compress_ptr_J_BUF_MODE *)pjVar5;
      lVar8 = lVar8 + 1;
      piVar7 = piVar7 + 0x18;
    } while (lVar8 < cinfo->num_components);
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_c_coef_controller(j_compress_ptr cinfo, boolean need_full_buffer)
{
  my_coef_ptr coef;

  coef = (my_coef_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(my_coef_controller));
  cinfo->coef = (struct jpeg_c_coef_controller *)coef;
  coef->pub.start_pass = start_pass_coef;

  /* Create the coefficient buffer. */
  if (need_full_buffer) {
#ifdef FULL_COEF_BUFFER_SUPPORTED
    /* Allocate a full-image virtual array for each component, */
    /* padded to a multiple of samp_factor DCT blocks in each direction. */
    int ci;
    jpeg_component_info *compptr;

    for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
         ci++, compptr++) {
      coef->whole_image[ci] = (*cinfo->mem->request_virt_barray)
        ((j_common_ptr)cinfo, JPOOL_IMAGE, FALSE,
         (JDIMENSION)jround_up((long)compptr->width_in_blocks,
                               (long)compptr->h_samp_factor),
         (JDIMENSION)jround_up((long)compptr->height_in_blocks,
                               (long)compptr->v_samp_factor),
         (JDIMENSION)compptr->v_samp_factor);
    }
#else
    ERREXIT(cinfo, JERR_BAD_BUFFER_MODE);
#endif
  } else {
    /* We only need a single-MCU buffer. */
    JBLOCKROW buffer;
    int i;

    buffer = (JBLOCKROW)
      (*cinfo->mem->alloc_large) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                  C_MAX_BLOCKS_IN_MCU * sizeof(JBLOCK));
    for (i = 0; i < C_MAX_BLOCKS_IN_MCU; i++) {
      coef->MCU_buffer[i] = buffer + i;
    }
    coef->whole_image[0] = NULL; /* flag for no virtual arrays */
  }
}